

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O2

void __thiscall QFontComboBox::setCurrentFont(QFontComboBox *this,QFont *font)

{
  QFont *this_00;
  QFontComboBoxPrivate *this_01;
  char cVar1;
  
  this_01 = *(QFontComboBoxPrivate **)&(this->super_QComboBox).super_QWidget.field_0x8;
  this_00 = &this_01->currentFont;
  cVar1 = QFont::operator!=(font,this_00);
  if (cVar1 != '\0') {
    QFont::operator=(this_00,font);
    QFontComboBoxPrivate::updateModel(this_01);
    cVar1 = QFont::operator==(this_00,font);
    if (cVar1 != '\0') {
      currentFontChanged(this,this_00);
      return;
    }
  }
  return;
}

Assistant:

void QFontComboBox::setCurrentFont(const QFont &font)
{
    Q_D(QFontComboBox);
    if (font != d->currentFont) {
        d->currentFont = font;
        d->updateModel();
        if (d->currentFont == font) { //else the signal has already be emitted by updateModel
            emit currentFontChanged(d->currentFont);
        }
    }
}